

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gp3p::sPolynomial47
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0xa63];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x26f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xa93] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0x9ad];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x2ff] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xa9d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x56f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xbed] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x5ff] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xcad] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x80f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe23] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x8cf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe53] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd9d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x95f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe2d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x98f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe5d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x9bf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe83] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa7f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe8d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xbff] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf43] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xcbf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf73] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xebd] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xd4f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf4d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xd7f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf7d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xdaf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfa3] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe6f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xfad] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xecf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfd3] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xf8f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xfdd] / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial47( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(47,12) = groebnerMatrix(19,56)/(groebnerMatrix(19,55));
  groebnerMatrix(47,15) = -groebnerMatrix(29,56)/(groebnerMatrix(29,51));
  groebnerMatrix(47,28) = -groebnerMatrix(29,63)/(groebnerMatrix(29,51));
  groebnerMatrix(47,31) = -groebnerMatrix(29,67)/(groebnerMatrix(29,51));
  groebnerMatrix(47,42) = groebnerMatrix(19,75)/(groebnerMatrix(19,55));
  groebnerMatrix(47,46) = (groebnerMatrix(19,76)/(groebnerMatrix(19,55))-groebnerMatrix(29,72)/(groebnerMatrix(29,51)));
  groebnerMatrix(47,49) = -groebnerMatrix(29,75)/(groebnerMatrix(29,51));
  groebnerMatrix(47,50) = -groebnerMatrix(29,76)/(groebnerMatrix(29,51));
  groebnerMatrix(47,51) = groebnerMatrix(19,77)/(groebnerMatrix(19,55));
  groebnerMatrix(47,55) = -groebnerMatrix(29,77)/(groebnerMatrix(29,51));
  groebnerMatrix(47,63) = groebnerMatrix(19,81)/(groebnerMatrix(19,55));
  groebnerMatrix(47,67) = (groebnerMatrix(19,82)/(groebnerMatrix(19,55))-groebnerMatrix(29,78)/(groebnerMatrix(29,51)));
  groebnerMatrix(47,70) = -groebnerMatrix(29,81)/(groebnerMatrix(29,51));
  groebnerMatrix(47,71) = -groebnerMatrix(29,82)/(groebnerMatrix(29,51));
  groebnerMatrix(47,72) = groebnerMatrix(19,83)/(groebnerMatrix(19,55));
  groebnerMatrix(47,76) = -groebnerMatrix(29,83)/(groebnerMatrix(29,51));
  groebnerMatrix(47,78) = groebnerMatrix(19,84)/(groebnerMatrix(19,55));
  groebnerMatrix(47,82) = -groebnerMatrix(29,84)/(groebnerMatrix(29,51));
}